

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

Option * __thiscall MetaCommand::GetOptionByMinusTag(MetaCommand *this,string *minusTag)

{
  Option *pOVar1;
  __type _Var2;
  Option *pOVar3;
  string tagToSearch;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pOVar1 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pOVar3 = pOVar1;
    if (pOVar3 == (this->m_OptionVector).
                  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      return (Option *)0x0;
    }
    std::__cxx11::string::string((string *)&local_50,"-",&local_51);
    std::__cxx11::string::append((string *)&local_50);
    _Var2 = std::operator==(&local_50,minusTag);
    std::__cxx11::string::~string((string *)&local_50);
    pOVar1 = pOVar3 + 1;
  } while (!_Var2);
  return pOVar3;
}

Assistant:

MetaCommand::Option *
MetaCommand::GetOptionByMinusTag(METAIO_STL::string minusTag)
{
  auto it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    METAIO_STL::string tagToSearch = "-";
    tagToSearch += (*it).tag;
    if(tagToSearch == minusTag)
      {
      return &(*it);
      }
    ++it;
    }
    return nullptr;
}